

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

socket_t __thiscall httplib::Client::create_client_socket(Client *this)

{
  uint uVar1;
  socket_t sVar2;
  detail *this_00;
  int in_R9D;
  anon_class_16_2_b2831607 fn;
  time_t local_8;
  
  local_8 = this->timeout_sec_;
  if ((this->proxy_host_)._M_string_length == 0) {
    this_00 = (detail *)(this->host_)._M_dataplus._M_p;
    uVar1 = this->port_;
  }
  else {
    this_00 = (detail *)(this->proxy_host_)._M_dataplus._M_p;
    uVar1 = this->proxy_port_;
  }
  fn.timeout_sec = (time_t *)0x0;
  fn.intf = (string *)&local_8;
  sVar2 = detail::
          create_socket<httplib::detail::create_client_socket(char_const*,int,long,std::__cxx11::string_const&)::_lambda(int,addrinfo&)_1_>
                    (this_00,(char *)(ulong)uVar1,(int)this + 0x138,fn,in_R9D);
  return sVar2;
}

Assistant:

inline socket_t Client::create_client_socket() const {
  if (!proxy_host_.empty()) {
    return detail::create_client_socket(proxy_host_.c_str(), proxy_port_,
                                        timeout_sec_, interface_);
  }
  return detail::create_client_socket(host_.c_str(), port_, timeout_sec_,
                                      interface_);
}